

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O1

DNA * __thiscall Population::GetDNAWithProbability(Population *this,double probability)

{
  DNA *pDVar1;
  DNA *pDVar2;
  DNA *pDVar3;
  DNA *pDVar4;
  DNA *pDVar5;
  bool bVar6;
  double dVar7;
  
  pDVar1 = (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
           super__Vector_impl_data._M_start;
  pDVar2 = (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar6 = pDVar1 == pDVar2;
  pDVar4 = pDVar1;
  if ((!bVar6) && (pDVar1->fitness <= probability)) {
    dVar7 = pDVar1->fitness + 0.0;
    pDVar3 = pDVar1;
    do {
      pDVar5 = pDVar3 + 1;
      bVar6 = pDVar5 == pDVar2;
      pDVar4 = pDVar1;
      if (bVar6) break;
      dVar7 = dVar7 + pDVar3[1].fitness;
      pDVar4 = pDVar5;
      pDVar3 = pDVar5;
    } while (dVar7 <= probability);
  }
  if (!bVar6) {
    return pDVar4;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vocheretnyi[P]genetic-schedule/Population.cpp"
                ,0x9c,"const DNA &Population::GetDNAWithProbability(double) const");
}

Assistant:

const DNA& Population::GetDNAWithProbability(double probability) const {
    double sum = 0.0f;
    for (const DNA& dna : population_) {
        sum += dna.fitness;
        if (probability < sum) {
            return dna;
        }
    }
    assert(false);
    return DNA();
}